

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  bool bVar1;
  Field fieldSchema;
  Reader fieldValue;
  CapTableReader *pCVar2;
  WirePointer *pWVar3;
  ElementCount index;
  StringPtr name;
  DebugExpression<bool> _kjCondition_1;
  Reader field;
  StructSchema type_local;
  Fault f_1;
  Fault f;
  CapTableReader *local_158 [16];
  StructReader local_d8;
  DebugExpression<bool> _kjCondition;
  ListReader local_60;
  
  type_local = type;
  if (input._reader.dataSize < 0x10) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *input._reader.data == 5;
    if (_kjCondition.value) {
      if (input._reader.pointerCount == 0) {
        input._reader.nestingLimit = 0x7fffffff;
        input._reader.capTable = (CapTableReader *)0x0;
        input._reader.pointers = (WirePointer *)0x0;
        input._reader.segment = (SegmentReader *)0x0;
      }
      local_158[0] = input._reader.capTable;
      f.exception = (Exception *)input._reader.segment;
      index = 0;
      capnp::_::PointerReader::getList(&local_60,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
      local_158[1] = (CapTableReader *)input._reader.pointers;
      local_158[2]._0_4_ = input._reader.nestingLimit;
      if (local_60.elementCount == 0) {
        return;
      }
      do {
        capnp::_::ListReader::getStructElement(&field._reader,&local_60,index);
        f_1.exception = (Exception *)field._reader.segment;
        if (field._reader.pointerCount == 0) {
          f_1.exception = (Exception *)0x0;
        }
        name.content = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&f_1,(void *)0x0,0);
        StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&f,&type_local,name);
        if ((char)f.exception == '\x01') {
          pCVar2 = local_158[0];
          fieldSchema.proto._reader.segment._4_4_ = local_158[2]._4_4_;
          fieldSchema.proto._reader.segment._0_4_ = local_158[2]._0_4_;
          if (field._reader.pointerCount < 2) {
            local_158[2]._0_4_ = 0x7fffffff;
            local_158[0] = (CapTableReader *)0x0;
            pWVar3 = (WirePointer *)0x0;
            f.exception = (Exception *)0x0;
          }
          else {
            pWVar3 = field._reader.pointers + 1;
            local_158[0] = field._reader.capTable;
            f.exception = (Exception *)field._reader.segment;
            local_158[2]._0_4_ = field._reader.nestingLimit;
          }
          capnp::_::PointerReader::getStruct(&local_d8,(PointerReader *)&f,(word *)0x0);
          fieldSchema._8_8_ = local_158[1];
          fieldSchema.parent.super_Schema.raw = (Schema)(Schema)pCVar2;
          fieldSchema.proto._reader.capTable = local_158[3];
          fieldSchema.proto._reader.data = local_158[4];
          fieldSchema.proto._reader.pointers = (WirePointer *)local_158[5];
          fieldSchema.proto._reader._32_8_ = local_158[6];
          fieldSchema.proto._reader._40_8_ = local_158[7];
          fieldValue._reader.capTable = local_d8.capTable;
          fieldValue._reader.segment = local_d8.segment;
          fieldValue._reader.data = local_d8.data;
          fieldValue._reader.pointers = local_d8.pointers;
          fieldValue._reader.dataSize = local_d8.dataSize;
          fieldValue._reader.pointerCount = local_d8.pointerCount;
          fieldValue._reader._38_2_ = local_d8._38_2_;
          fieldValue._reader.nestingLimit = local_d8.nestingLimit;
          fieldValue._reader._44_4_ = local_d8._44_4_;
          decodeField(this,fieldSchema,fieldValue,orphanage,output);
          local_158[1] = (CapTableReader *)pWVar3;
        }
        else {
          bVar1 = ((this->impl).ptr)->rejectUnknownFields;
          _kjCondition_1.value = (bool)(bVar1 ^ 1);
          if (bVar1 != false) {
            _f = (ArrayPtr<const_char>)json::Value::Field::Reader::getName(&field);
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[14],capnp::Text::Reader>
                      (&f_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,399,FAILED,"!impl->rejectUnknownFields",
                       "_kjCondition,\"Unknown field\", field.getName()",&_kjCondition_1,
                       (char (*) [14])"Unknown field",(Reader *)&f);
            kj::_::Debug::Fault::fatal(&f_1);
          }
        }
        index = index + 1;
      } while (local_60.elementCount != index);
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x18a,FAILED,"input.isObject()","_kjCondition,\"Expected object value\"",&_kjCondition
             ,(char (*) [22])"Expected object value");
  kj::_::Debug::Fault::~Fault(&f);
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_SOME(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(fieldSchema, field.getValue(), orphanage, output);
    } else {
      KJ_REQUIRE(!impl->rejectUnknownFields, "Unknown field", field.getName());
    }
  }